

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

void __thiscall Memory::LargeHeapBlock::CapturePageHeapAllocStack(LargeHeapBlock *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PageHeapData *pPVar4;
  StackBackTrace *pSVar5;
  
  pPVar4 = this->pageHeapData;
  if ((pPVar4 != (PageHeapData *)0x0) && (pPVar4->pageHeapMode != PageHeapModeOff)) {
    if (pPVar4->pageHeapFreeStack != (StackBackTrace *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x974,"(this->pageHeapData->pageHeapFreeStack == nullptr)",
                         "this->pageHeapData->pageHeapFreeStack == nullptr");
      if (!bVar2) goto LAB_0065f750;
      *puVar3 = 0;
      pPVar4 = this->pageHeapData;
    }
    if (pPVar4->pageHeapAllocStack == (StackBackTrace *)0x0) {
      pSVar5 = (StackBackTrace *)0x0;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x975,"(this->pageHeapData->pageHeapAllocStack == nullptr)",
                         "this->pageHeapData->pageHeapAllocStack == nullptr");
      if (!bVar2) {
LAB_0065f750:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      pSVar5 = this->pageHeapData->pageHeapAllocStack;
    }
    if ((pSVar5 == (StackBackTrace *)0x0) || (pSVar5 == PageHeapData::s_StackTraceAllocFailed)) {
      pSVar5 = StackBackTrace::Capture<Memory::NoThrowHeapAllocator>
                         ((NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,10,0x20);
      pPVar4 = this->pageHeapData;
      pPVar4->pageHeapAllocStack = pSVar5;
    }
    else {
      StackBackTrace::Capture(pSVar5,10);
      pPVar4 = this->pageHeapData;
      pSVar5 = pPVar4->pageHeapAllocStack;
    }
    if (pSVar5 == (StackBackTrace *)0x0) {
      pPVar4->pageHeapAllocStack = PageHeapData::s_StackTraceAllocFailed;
    }
  }
  return;
}

Assistant:

void
LargeHeapBlock::CapturePageHeapAllocStack()
{
#ifdef STACK_BACK_TRACE
    if (this->InPageHeapMode()) // pageheap can be enabled only for some of the buckets
    {
        // These asserts are true because explicit free is disallowed in
        // page heap mode. If they weren't, we'd have to modify the asserts
        Assert(this->pageHeapData->pageHeapFreeStack == nullptr);
        Assert(this->pageHeapData->pageHeapAllocStack == nullptr);

        // Note: NoCheckHeapAllocator will fail fast if we can't allocate the stack to capture
        // REVIEW: Should we have a flag to configure the number of frames captured?
        if (pageHeapData->pageHeapAllocStack != nullptr && this->pageHeapData->pageHeapAllocStack != PageHeapData::s_StackTraceAllocFailed)
        {
            this->pageHeapData->pageHeapAllocStack->Capture(Recycler::s_numFramesToSkipForPageHeapAlloc);
        }
        else
        {
            this->pageHeapData->pageHeapAllocStack = StackBackTrace::Capture(&NoThrowHeapAllocator::Instance,
                Recycler::s_numFramesToSkipForPageHeapAlloc, Recycler::s_numFramesToCaptureForPageHeap);
        }

        if (this->pageHeapData->pageHeapAllocStack == nullptr)
        {
            this->pageHeapData->pageHeapAllocStack = const_cast<StackBackTrace*>(PageHeapData::s_StackTraceAllocFailed); // allocate failed, mark it we have tried
        }
    }
#endif
}